

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.h
# Opt level: O1

bool __thiscall sing::HttpRequest::keepAlive(HttpRequest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  string connection;
  string local_80;
  string local_60;
  string local_40;
  
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Connection","");
  getHeaders(&local_60,this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_60);
  bVar4 = true;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar3 != 0) {
      if (this->version == HTTP11) {
        iVar3 = std::__cxx11::string::compare((char *)&local_60);
        if (iVar3 != 0) goto LAB_0010ecd6;
      }
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Keep-Alive","");
      getHeaders(&local_80,this,&local_40);
      bVar4 = local_80._M_string_length != 0;
      bVar2 = true;
      goto LAB_0010ed19;
    }
  }
LAB_0010ecd6:
  bVar2 = false;
LAB_0010ed19:
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool keepAlive() const{
        std::string connection = getHeaders("Connection");
        bool res = (connection == "Keep-Alive" || connection == "keep-alive") 
            || (version == HTTP11 && connection != "close") 
            || (!getHeaders("Keep-Alive").empty());

        return res;
    }